

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

void Nwk_ManMarkTfiCone_rec(Nwk_Obj_t *pObj)

{
  long lVar1;
  
  if (((*(uint *)&pObj->field_0x20 & 0x10) == 0) &&
     (*(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10, 0 < pObj->nFanins)) {
    lVar1 = 0;
    do {
      if (pObj->pFanio[lVar1] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManMarkTfiCone_rec(pObj->pFanio[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pObj->nFanins);
  }
  return;
}

Assistant:

void Nwk_ManMarkTfiCone_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return;
    pObj->MarkA = 1;
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManMarkTfiCone_rec( pNext );
}